

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O1

int coda_path_find_file(char *searchpath,char *filename,char **location)

{
  bool bVar1;
  size_t sVar2;
  char *__ptr;
  size_t sVar3;
  char *pcVar4;
  char *__s;
  char *pcVar5;
  int iVar6;
  char *__s_00;
  stat sb;
  int local_e0;
  int local_dc;
  stat local_c0;
  
  sVar2 = strlen(filename);
  if ((searchpath == (char *)0x0) || (*searchpath == '\0')) {
    *location = (char *)0x0;
LAB_001380b9:
    local_e0 = 0;
  }
  else {
    __ptr = strdup(searchpath);
    if (__ptr == (char *)0x0) {
      local_e0 = -1;
      coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                     ,0x187);
    }
    else {
      local_dc = 0;
      __s = (char *)0x0;
      __s_00 = __ptr;
      do {
        pcVar5 = __s_00;
        if (*__s_00 == '\0') {
          if (__s != (char *)0x0) {
            free(__s);
          }
          free(__ptr);
          *location = (char *)0x0;
          goto LAB_001380b9;
        }
        for (; *pcVar5 != '\0'; pcVar5 = pcVar5 + 1) {
          if (*pcVar5 == ':') {
            *pcVar5 = '\0';
            pcVar5 = pcVar5 + 1;
            break;
          }
        }
        sVar3 = strlen(__s_00);
        iVar6 = (int)sVar3 + (int)sVar2;
        if (iVar6 < local_dc) {
LAB_0013804a:
          sprintf(__s,"%s/%s",__s_00,filename);
          iVar6 = stat(__s,&local_c0);
          bVar1 = true;
          if ((iVar6 == 0) && ((local_c0.st_mode._1_1_ & 0x80) != 0)) {
            *location = __s;
            free(__ptr);
            bVar1 = false;
            local_e0 = 0;
            pcVar5 = __s_00;
          }
        }
        else {
          pcVar4 = (char *)realloc(__s,(long)(iVar6 + 2));
          if (pcVar4 == (char *)0x0) {
            local_e0 = -1;
            coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                           "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                          );
            if (__s != (char *)0x0) {
              free(__s);
            }
          }
          else {
            local_dc = iVar6 + 1;
            __s = pcVar4;
          }
          if (pcVar4 != (char *)0x0) goto LAB_0013804a;
          bVar1 = false;
          pcVar5 = __s_00;
        }
        __s_00 = pcVar5;
      } while (bVar1);
    }
  }
  return local_e0;
}

Assistant:

int coda_path_find_file(const char *searchpath, const char *filename, char **location)
{
#ifdef WIN32
    const char path_separator_char = ';';
#else
    const char path_separator_char = ':';
#endif
    char *path;
    char *path_component;
    char *filepath = NULL;
    int filepath_length = 0;
    int filename_length = (int)strlen(filename);

    if (searchpath == NULL || searchpath[0] == '\0')
    {
        *location = NULL;
        return 0;
    }

    path = strdup(searchpath);
    if (path == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        return -1;
    }
    path_component = path;
    while (*path_component != '\0')
    {
        struct stat sb;
        char *p;
        int path_component_length;

        p = path_component;
        while (*p != '\0' && *p != path_separator_char)
        {
            p++;
        }
        if (*p != '\0')
        {
            *p = '\0';
            p++;
        }

        path_component_length = (int)strlen(path_component);
        if (filepath_length < path_component_length + filename_length + 1)
        {
            char *new_filepath;

            new_filepath = realloc(filepath, path_component_length + filename_length + 2);
            if (new_filepath == NULL)
            {
                coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                               __LINE__);
                if (filepath != NULL)
                {
                    free(filepath);
                }
                return -1;
            }
            filepath = new_filepath;
            filepath_length = path_component_length + filename_length + 1;
        }
        sprintf(filepath, "%s/%s", path_component, filename);

        if (stat(filepath, &sb) == 0)
        {
            if (sb.st_mode & S_IFREG)
            {
                /* we found the file */
                *location = filepath;
                free(path);
                return 0;
            }
        }

        path_component = p;
    }

    if (filepath != NULL)
    {
        free(filepath);
    }
    free(path);

    /* the file was not found */
    *location = NULL;
    return 0;
}